

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SimInfo::getGlobalAtomIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SimInfo *this)

{
  pointer ppAVar1;
  pointer piVar2;
  Molecule *pMVar3;
  pointer ppAVar4;
  Atom *pAVar5;
  allocator_type local_29;
  MoleculeIterator local_28;
  value_type_conflict1 local_1c;
  
  local_1c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(ulong)(uint)this->nAtoms_,&local_1c,&local_29);
  local_28._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_28._M_node == &(this->molecules_)._M_t._M_impl.super__Rb_tree_header)
  {
    pMVar3 = (Molecule *)0x0;
  }
  else {
    pMVar3 = (Molecule *)local_28._M_node[1]._M_parent;
  }
  while (pMVar3 != (Molecule *)0x0) {
    ppAVar4 = (pMVar3->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppAVar1 = (pMVar3->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppAVar4 == ppAVar1) {
      pAVar5 = (Atom *)0x0;
    }
    else {
      pAVar5 = *ppAVar4;
    }
    piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    while (ppAVar4 = ppAVar4 + 1, pAVar5 != (Atom *)0x0) {
      piVar2[(pAVar5->super_StuntDouble).localIndex_] = (pAVar5->super_StuntDouble).globalIndex_;
      if (ppAVar4 == ppAVar1) {
        pAVar5 = (Atom *)0x0;
      }
      else {
        pAVar5 = *ppAVar4;
      }
    }
    pMVar3 = nextMolecule(this,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> SimInfo::getGlobalAtomIndices() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;

    vector<int> GlobalAtomIndices(getNAtoms(), 0);

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        GlobalAtomIndices[atom->getLocalIndex()] = atom->getGlobalIndex();
      }
    }
    return GlobalAtomIndices;
  }